

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_address.cpp
# Opt level: O0

CreatePegInAddressResponseStruct *
cfd::js::api::ElementsAddressStructApi::CreatePegInAddress
          (CreatePegInAddressResponseStruct *__return_storage_ptr__,
          CreatePegInAddressRequestStruct *request)

{
  CreatePegInAddressRequestStruct *this;
  string *in_R8;
  allocator local_169;
  function<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&)>
  local_168;
  undefined1 local_148 [302];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  CreatePegInAddressRequestStruct *pCStack_18;
  anon_class_1_0_00000001 call_func;
  CreatePegInAddressRequestStruct *request_local;
  CreatePegInAddressResponseStruct *result;
  
  local_1a = 0;
  pCStack_18 = request;
  CreatePegInAddressResponseStruct::CreatePegInAddressResponseStruct(__return_storage_ptr__);
  this = pCStack_18;
  std::
  function<cfd::js::api::CreatePegInAddressResponseStruct(cfd::js::api::CreatePegInAddressRequestStruct_const&)>
  ::
  function<cfd::js::api::ElementsAddressStructApi::CreatePegInAddress(cfd::js::api::CreatePegInAddressRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::CreatePegInAddressResponseStruct(cfd::js::api::CreatePegInAddressRequestStruct_const&)>
              *)local_148,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"CreatePegInAddress",&local_169);
  ExecuteStructApi<cfd::js::api::CreatePegInAddressRequestStruct,cfd::js::api::CreatePegInAddressResponseStruct>
            ((CreatePegInAddressResponseStruct *)(local_148 + 0x20),(api *)this,
             (CreatePegInAddressRequestStruct *)local_148,&local_168,in_R8);
  CreatePegInAddressResponseStruct::operator=
            (__return_storage_ptr__,(CreatePegInAddressResponseStruct *)(local_148 + 0x20));
  CreatePegInAddressResponseStruct::~CreatePegInAddressResponseStruct
            ((CreatePegInAddressResponseStruct *)(local_148 + 0x20));
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::
  function<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&)>
  ::~function((function<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&)>
               *)local_148);
  return __return_storage_ptr__;
}

Assistant:

CreatePegInAddressResponseStruct ElementsAddressStructApi::CreatePegInAddress(
    const CreatePegInAddressRequestStruct& request) {
  auto call_func = [](const CreatePegInAddressRequestStruct& request)
      -> CreatePegInAddressResponseStruct {  // NOLINT
    CreatePegInAddressResponseStruct response;

    // convert request arguments from struct
    Script fedpegscript = Script(request.fedpegscript);
    // Pubkey pubkey = Pubkey(request.pubkey);
    NetType net_type = AddressStructApi::ConvertNetType(request.network);
    AddressType address_type =
        AddressApiBase::ConvertAddressType(request.hash_type);

    // prepare output parameters
    Script claim_script;
    Script tweak_fedpegscript;
    Pubkey pubkey;
    Script redeem_script;
    if (!request.redeem_script.empty()) {
      redeem_script = Script(request.redeem_script);
    } else {
      pubkey = Pubkey(request.pubkey);
    }

    ElementsAddressApi api;
    Address pegin_address = api.CreatePegInAddress(
        net_type, address_type, fedpegscript, pubkey, redeem_script,
        &claim_script, &tweak_fedpegscript);

    // convert parameters to response struct
    response.mainchain_address = pegin_address.GetAddress();
    if (claim_script.IsEmpty()) {
      response.ignore_items.insert("claimScript");
    } else {
      response.claim_script = claim_script.GetHex();
    }
    if (tweak_fedpegscript.IsEmpty()) {
      response.ignore_items.insert("tweakFedpegscript");
    } else {
      response.tweak_fedpegscript = tweak_fedpegscript.GetHex();
    }
    return response;
  };

  CreatePegInAddressResponseStruct result;
  result = ExecuteStructApi<
      CreatePegInAddressRequestStruct, CreatePegInAddressResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}